

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O3

void __thiscall
RecordManager::FindandPrint
          (RecordManager *this,STMT *S,set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps)

{
  pointer pcVar1;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> target;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  vector<int,_std::allocator<int>_> *pvStack_110;
  vector<value,_std::allocator<value>_> *local_108;
  vector<condition,_std::allocator<condition>_> *pvStack_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  vector<int,_std::allocator<int>_> *pvStack_c8;
  vector<value,_std::allocator<value>_> *local_c0;
  vector<condition,_std::allocator<condition>_> *pvStack_b8;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_b0;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_80;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_50;
  
  local_f8[0] = S->is_select_all;
  pcVar1 = (S->tableName)._M_dataplus._M_p;
  local_f0._M_p = (pointer)&local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + (S->tableName)._M_string_length);
  local_d0 = S->colunmList;
  pvStack_c8 = S->colunmId;
  local_c0 = S->v_list;
  pvStack_b8 = S->c_list;
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::_Rb_tree
            (&local_80,&ps->_M_t);
  FindSuchRecord((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_50,this,
                 (STMT *)local_f8,(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_80);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  local_140[0] = S->is_select_all;
  pcVar1 = (S->tableName)._M_dataplus._M_p;
  local_138._M_p = (pointer)&local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + (S->tableName)._M_string_length);
  local_118 = S->colunmList;
  pvStack_110 = S->colunmId;
  local_108 = S->v_list;
  pvStack_100 = S->c_list;
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::_Rb_tree
            (&local_b0,&local_50);
  PrintRecord(this,(STMT *)local_140,(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_b0)
  ;
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != &local_128) {
    operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
  }
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_50);
  return;
}

Assistant:

void RecordManager::FindandPrint(STMT S, set<Addr>ps) {
	set<Addr> target = this->FindSuchRecord(S, ps);
	this->PrintRecord(S, target);
}